

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  basic_suite::run();
  number_suite::run();
  string_suite::run();
  compact_suite::run();
  record_suite::run();
  array_suite::run();
  assoc_array_suite::run();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    basic_suite::run();
    number_suite::run();
    string_suite::run();
    compact_suite::run();
    record_suite::run();
    array_suite::run();
    assoc_array_suite::run();

    return boost::report_errors();
}